

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O1

void __thiscall
ctemplate::TemplateDictionary::DictionaryPrinter::FillSortedGlobalDictMap
          (DictionaryPrinter *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *sorted_global_dict)

{
  uint uVar1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  mapped_type *this_00;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_node_base *p_Var5;
  bool bVar6;
  ReaderMutexLock ml;
  TemplateString key;
  ReaderMutexLock local_a0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_98;
  key_type local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  TemplateString local_50;
  
  local_a0.mu_ = (Mutex *)g_static_mutex;
  local_98 = sorted_global_dict;
  if (g_static_mutex[0x38] == '\x01') {
    iVar2 = pthread_rwlock_rdlock((pthread_rwlock_t *)g_static_mutex);
    if (iVar2 != 0) {
      abort();
    }
  }
  p_Var4 = (_Rb_tree_node_base *)0x0;
  if ((int)*global_dict_ < 0) {
    p_Var4 = *(_Rb_tree_node_base **)(global_dict_ + 8);
    p_Var5 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var5 = (_Rb_tree_node_base *)(global_dict_ + 2);
  }
  while( true ) {
    uVar1 = *global_dict_;
    if (p_Var5 == (_Rb_tree_node_base *)0x0) {
      p_Var3 = (_Rb_tree_node_base *)(global_dict_ + 4);
      if ((int)uVar1 >= 0) {
        p_Var3 = (_Rb_tree_node_base *)0x0;
      }
      bVar6 = p_Var4 == p_Var3 && (int)uVar1 < 0;
    }
    else {
      p_Var3 = (_Rb_tree_node_base *)0x0;
      if (-1 < (int)uVar1) {
        p_Var3 = (_Rb_tree_node_base *)(global_dict_ + (ulong)uVar1 * 10 + 2);
      }
      bVar6 = p_Var5 == p_Var3;
    }
    if (bVar6) break;
    p_Var3 = p_Var4 + 1;
    if (p_Var5 != (_Rb_tree_node_base *)0x0) {
      p_Var3 = p_Var5;
    }
    TemplateString::IdToString(&local_50,*(TemplateId *)p_Var3);
    if (local_50.ptr_ == (char *)0x0) {
      __assert_fail("!InvalidTemplateString(key)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                    ,0x2d6,
                    "void ctemplate::TemplateDictionary::DictionaryPrinter::FillSortedGlobalDictMap(map<string, string> *)"
                   );
    }
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,p_Var3->_M_parent,
               (long)&p_Var3->_M_parent->_M_color + (long)&p_Var3->_M_left->_M_color);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,local_50.ptr_,local_50.ptr_ + local_50.length_);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](local_98,&local_90);
    std::__cxx11::string::operator=((string *)this_00,(string *)local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    if (p_Var5 == (_Rb_tree_node_base *)0x0) {
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    }
    else {
      p_Var5 = (_Rb_tree_node_base *)&p_Var5[1]._M_parent;
    }
  }
  ReaderMutexLock::~ReaderMutexLock(&local_a0);
  return;
}

Assistant:

LOCKS_EXCLUDED(g_static_mutex) {
      ReaderMutexLock ml(&g_static_mutex);
      for (GlobalDict::const_iterator it = global_dict_->begin();
           it != global_dict_->end(); ++it) {
        const TemplateString key = TemplateDictionary::IdToString(it->first);
        assert(!InvalidTemplateString(key));  // checks key.ptr_ != NULL
        (*sorted_global_dict)[PrintableTemplateString(key)] =
            PrintableTemplateString(it->second);
      }
  }